

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aegis256.cc
# Opt level: O0

int aead_aegis_256_init(EVP_AEAD_CTX *ctx,uint8_t *key,size_t key_len,size_t tag_len)

{
  aead_aegis_256_ctx *aegis_ctx;
  size_t tag_len_local;
  size_t key_len_local;
  uint8_t *key_local;
  EVP_AEAD_CTX *ctx_local;
  
  if (key_len == 0x20) {
    aegis_ctx = (aead_aegis_256_ctx *)tag_len;
    if (tag_len == 0) {
      aegis_ctx = (aead_aegis_256_ctx *)0x10;
    }
    if (aegis_ctx == (aead_aegis_256_ctx *)0x10) {
      OPENSSL_memcpy(&ctx->state,key,0x20);
      ctx->tag_len = '\x10';
      ctx_local._4_4_ = 1;
    }
    else {
      ERR_put_error(0x1e,0,0x74,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aegis256.cc"
                    ,0x5a);
      ctx_local._4_4_ = 0;
    }
  }
  else {
    ERR_put_error(0x1e,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aegis256.cc"
                  ,0x53);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int aead_aegis_256_init(EVP_AEAD_CTX *ctx, const uint8_t *key,
                                size_t key_len, size_t tag_len) {
  if (key_len != AEGIS_256_KEY_LEN) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BAD_KEY_LENGTH);
    return 0;
  }
  if (tag_len == EVP_AEAD_DEFAULT_TAG_LENGTH) {
    tag_len = AEGIS_256_TAG_LEN;
  }
  if (tag_len != AEGIS_256_TAG_LEN) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_TAG_TOO_LARGE);
    return 0;
  }

  struct aead_aegis_256_ctx *aegis_ctx =
      (struct aead_aegis_256_ctx *)&ctx->state;
  OPENSSL_memcpy(aegis_ctx->key, key, key_len);
  ctx->tag_len = tag_len;

  return 1;
}